

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

void Js::JavascriptObject::Restify
               (Var source,Var to,void *excludedStatic,void *excludedComputed,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  void *pvVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *allocator;
  uint local_88;
  PropertyId id_1;
  uint32 i_1;
  uint local_74;
  PropertyId id;
  uint32 i;
  BVSparse<Memory::Recycler> excluded;
  PropertyIdArray *propIdsComputed;
  PropertyIdArray *propIdsStatic;
  RecyclableObject *pRStack_38;
  bool succeeded;
  RecyclableObject *target;
  ScriptContext *scriptContext_local;
  void *excludedComputed_local;
  void *excludedStatic_local;
  Var to_local;
  Var source_local;
  
  pRStack_38 = (RecyclableObject *)0x0;
  target = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)excludedComputed;
  excludedComputed_local = excludedStatic;
  excludedStatic_local = to;
  to_local = source;
  BVar4 = JavascriptConversion::ToObject(to,scriptContext,&stack0xffffffffffffffc8);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x8b4,"(succeeded)","succeeded");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvVar2 = excludedComputed_local;
  excluded.lastUsedNodePrevNextField.ptr =
       (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)scriptContext_local;
  allocator = ScriptContext::GetRecycler((ScriptContext *)target);
  BVSparse<Memory::Recycler>::BVSparse((BVSparse<Memory::Recycler> *)&id,allocator);
  for (local_74 = 0; local_74 < *pvVar2; local_74 = local_74 + 1) {
    BVSparse<Memory::Recycler>::Set
              ((BVSparse<Memory::Recycler> *)&id,
               *(BVIndex *)((long)pvVar2 + (ulong)local_74 * 4 + 8));
  }
  if ((WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)pvVar2 !=
      excluded.lastUsedNodePrevNextField.ptr) {
    for (local_88 = 0; local_88 < *(uint *)&(excluded.lastUsedNodePrevNextField.ptr)->ptr;
        local_88 = local_88 + 1) {
      BVSparse<Memory::Recycler>::Set
                ((BVSparse<Memory::Recycler> *)&id,
                 *(BVIndex *)
                  ((long)&excluded.lastUsedNodePrevNextField.ptr[1].ptr + (ulong)local_88 * 4));
    }
  }
  CopyDataPropertiesHelper<false,false>
            (to_local,pRStack_38,(ScriptContext *)target,(BVSparse<Memory::Recycler> *)&id);
  BVSparse<Memory::Recycler>::~BVSparse((BVSparse<Memory::Recycler> *)&id);
  return;
}

Assistant:

void JavascriptObject::Restify(Var source, Var to, void* excludedStatic, void* excludedComputed, ScriptContext* scriptContext)
{
    RecyclableObject* target = nullptr;
    bool succeeded = JavascriptConversion::ToObject(to, scriptContext, &target);
    AssertOrFailFast(succeeded);

    const Js::PropertyIdArray* propIdsStatic = reinterpret_cast<const Js::PropertyIdArray*>(excludedStatic);
    const Js::PropertyIdArray* propIdsComputed = reinterpret_cast<const Js::PropertyIdArray*>(excludedComputed);
    // Create a set of the property ids for faster lookup
    BVSparse<Recycler> excluded(scriptContext->GetRecycler());
    for (uint32 i = 0; i < propIdsStatic->count; i++)
    {
        PropertyId id = propIdsStatic->elements[i];
        excluded.Set(id);
    }
    // If these two are equal, this means there were no computed properties
    // and the static array was passed in to indicate this
    if (propIdsStatic != propIdsComputed)
    {
        for (uint32 i = 0; i < propIdsComputed->count; i++)
        {
            PropertyId id = propIdsComputed->elements[i];
            excluded.Set(id);
        }
    }

    CopyDataPropertiesHelper<false, false>(source, target, scriptContext, &excluded);
}